

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

void __thiscall QJsonObject::removeImpl<QLatin1String>(QJsonObject *this,QLatin1String key)

{
  long lVar1;
  bool bVar2;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RDX;
  bool *in_RSI;
  long in_FS_OFFSET;
  qsizetype index;
  bool keyExists;
  undefined1 in_stack_00000050 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494783);
  if (!bVar2) {
    indexOf<QLatin1String>(in_RDX,(QLatin1String)in_stack_00000050,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonObject::removeImpl(T key)
{
    if (!o)
        return;

    bool keyExists;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists)
        return;

    removeAt(index);
}